

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

vector<short,_std::allocator<short>_> *
multiplicative_inverse_vector
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,coefficient_t m)

{
  pointer psVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  allocator_type local_11;
  
  std::vector<short,_std::allocator<short>_>::vector
            (__return_storage_ptr__,(long)(int)CONCAT62(in_register_00000032,m),&local_11);
  psVar1 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1[1] = 1;
  if (2 < m) {
    uVar2 = 2;
    do {
      psVar1[uVar2] =
           m - (short)((int)(((uint)(ushort)m / (uint)(ushort)uVar2) *
                            (int)psVar1[(ushort)((ushort)m % (ushort)uVar2)]) % (int)(uint)(ushort)m
                      );
      uVar2 = uVar2 + 1;
    } while ((ushort)m != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<coefficient_t> multiplicative_inverse_vector(const coefficient_t m) {
	std::vector<coefficient_t> inverse(m);
	inverse[1] = 1;
	// m = a * (m / a) + m % a
	// Multipying with inverse(a) * inverse(m % a):
	// 0 = inverse(m % a) * (m / a)  + inverse(a)  (mod m)
	for (coefficient_t a = 2; a < m; ++a) inverse[a] = m - (inverse[m % a] * (m / a)) % m;
	return inverse;
}